

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O1

void duckdb::InitializeUpdateData<unsigned_char>
               (UpdateInfo *base_info,Vector *base_data,UpdateInfo *update_info,
               UnifiedVectorFormat *update,SelectionVector *sel)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  data_ptr_t pdVar4;
  sel_t *psVar5;
  unsigned_long *puVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar1 = update_info->N;
  if ((ulong)uVar1 != 0) {
    pdVar4 = update->data;
    uVar2 = update_info->max;
    uVar7 = 0;
    do {
      uVar8 = uVar7;
      if (sel->sel_vector != (sel_t *)0x0) {
        uVar8 = (ulong)sel->sel_vector[uVar7];
      }
      psVar5 = update->sel->sel_vector;
      if (psVar5 != (sel_t *)0x0) {
        uVar8 = (ulong)psVar5[uVar8];
      }
      *(data_t *)((long)&update_info[1].segment + uVar7 + (ulong)uVar2 * 4) = pdVar4[uVar8];
      uVar7 = uVar7 + 1;
    } while (uVar1 != uVar7);
  }
  pdVar4 = base_data->data;
  FlatVector::VerifyFlatVector(base_data);
  uVar1 = base_info->N;
  if ((ulong)uVar1 != 0) {
    uVar2 = base_info->max;
    uVar7 = 0;
    do {
      uVar3 = *(uint *)((long)&base_info[1].segment + uVar7 * 4);
      puVar6 = (base_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar6 == (unsigned_long *)0x0) ||
         ((puVar6[uVar3 >> 6] >> ((ulong)uVar3 & 0x3f) & 1) != 0)) {
        *(data_t *)((long)&base_info[1].segment + uVar7 + (ulong)uVar2 * 4) = pdVar4[uVar3];
      }
      uVar7 = uVar7 + 1;
    } while (uVar1 != uVar7);
  }
  return;
}

Assistant:

static void InitializeUpdateData(UpdateInfo &base_info, Vector &base_data, UpdateInfo &update_info,
                                 UnifiedVectorFormat &update, const SelectionVector &sel) {
	auto update_data = update.GetData<T>(update);
	auto tuple_data = update_info.GetData<T>();

	for (idx_t i = 0; i < update_info.N; i++) {
		auto idx = update.sel->get_index(sel.get_index(i));
		tuple_data[i] = update_data[idx];
	}

	auto base_array_data = FlatVector::GetData<T>(base_data);
	auto &base_validity = FlatVector::Validity(base_data);
	auto base_tuple_data = base_info.GetData<T>();
	auto base_tuples = base_info.GetTuples();
	for (idx_t i = 0; i < base_info.N; i++) {
		auto base_idx = base_tuples[i];
		if (!base_validity.RowIsValid(base_idx)) {
			continue;
		}
		base_tuple_data[i] = UpdateSelectElement::Operation<T>(*base_info.segment, base_array_data[base_idx]);
	}
}